

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O1

void __thiscall
Clasp::ClaspVsids_t<Clasp::DomScore>::updateReason
          (ClaspVsids_t<Clasp::DomScore> *this,Solver *s,LitVec *lits,Literal r)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->scType_;
  if ((1 < uVar1) && (uVar4 = (ulong)(lits->ebo_).size, uVar4 != 0)) {
    uVar3 = 0;
    do {
      if ((uVar1 == 3) ||
         (uVar2 = (lits->ebo_).buf[uVar3].rep_,
         (*(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar2 & 0xfffffffc)) &
         (uVar2 & 2) * 2 + 4) == 0)) {
        updateVarActivity(this,s,(lits->ebo_).buf[uVar3].rep_ >> 2,1.0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (r.rep_ < 4 || (this->scType_ & 1) == 0) {
    return;
  }
  updateVarActivity(this,s,r.rep_ >> 2,1.0);
  return;
}

Assistant:

void ClaspVsids_t<ScoreType>::updateReason(const Solver& s, const LitVec& lits, Literal r) {
	if (scType_ > HeuParams::score_min) {
		const bool ms = scType_ == HeuParams::score_multi_set;
		for (LitVec::size_type i = 0, end = lits.size(); i != end; ++i) {
			if (ms || !s.seen(lits[i])) { updateVarActivity(s, lits[i].var()); }
		}
	}
	if ((scType_ & 1u) != 0 && r.var() != 0) { updateVarActivity(s, r.var()); }
}